

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2401980::MemPoolAccept::PreChecks
          (MemPoolAccept *this,ATMPArgs *args,Workspace *ws)

{
  long lVar1;
  LockPoints lp;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int32_t iVar5;
  CTransactionRef *ptx_00;
  size_t sVar6;
  CTransaction *pCVar7;
  size_type sVar8;
  CBlockIndex *pCVar9;
  CBlockIndex *pCVar10;
  LockPoints *pLVar11;
  element_type *peVar12;
  CAmount CVar13;
  size_type sVar14;
  size_type sVar15;
  reference phVar16;
  int64_t iVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<transaction_identifier<false>_>,_bool> pVar18;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar19;
  pair<std::_Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>,_bool>
  pVar20;
  uint64_t entry_sequence;
  Coin *coin;
  CTxIn *txin_2;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1_2;
  bool fSpendsCoinbase;
  size_t out;
  CTxIn *txin_1;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1_1;
  CCoinsViewCache *coins_cache;
  bool allow_rbf;
  CTransaction *ptxConflicting;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_> *entry;
  TxValidationState *state;
  vector<COutPoint,_std::allocator<COutPoint>_> *coins_to_uncache;
  bool bypass_limits;
  int64_t nAcceptTime;
  Txid *hash;
  CTransaction *tx;
  CTransactionRef *ptx;
  Limits cpfp_carve_out_limits;
  txiter conflict;
  Limits maybe_rbf_limits;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  int64_t nSigOpsCost;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  optional<LockPoints> lock_points;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_string;
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
  err;
  Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
  ancestors_retry;
  string error_message;
  Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
  ancestors;
  string reason;
  uint in_stack_fffffffffffff248;
  uint32_t in_stack_fffffffffffff24c;
  CTransaction *in_stack_fffffffffffff250;
  string *debug_message;
  CCoinsViewCache *in_stack_fffffffffffff258;
  string *reject_reason;
  CCoinsViewCache *in_stack_fffffffffffff260;
  TxValidationResult TVar21;
  uint256 *txid;
  BlockManager *in_stack_fffffffffffff268;
  CTxMemPool *this_01;
  long *in_stack_fffffffffffff270;
  undefined4 in_stack_fffffffffffff278;
  undefined2 in_stack_fffffffffffff27c;
  undefined1 in_stack_fffffffffffff27e;
  undefined1 in_stack_fffffffffffff27f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff288;
  allocator<char> *__a;
  optional<unsigned_int> *in_stack_fffffffffffff290;
  CCoinsViewCache *in_stack_fffffffffffff298;
  CTransaction *in_stack_fffffffffffff2a0;
  undefined7 in_stack_fffffffffffff2a8;
  undefined1 in_stack_fffffffffffff2af;
  CTxMemPool *in_stack_fffffffffffff2b0;
  MemPoolAccept *in_stack_fffffffffffff2b8;
  undefined7 in_stack_fffffffffffff2c0;
  undefined1 in_stack_fffffffffffff2c7;
  undefined8 in_stack_fffffffffffff2c8;
  uint entry_height;
  int64_t in_stack_fffffffffffff2d0;
  undefined7 in_stack_fffffffffffff2d8;
  undefined1 in_stack_fffffffffffff2df;
  CCoinsViewCache *in_stack_fffffffffffff2e0;
  CTxMemPoolEntry *in_stack_fffffffffffff2e8;
  CBlockIndex *in_stack_fffffffffffff2f0;
  undefined8 in_stack_fffffffffffff2f8;
  undefined1 fSearchForParents;
  Limits *in_stack_fffffffffffff300;
  undefined7 in_stack_fffffffffffff308;
  undefined1 in_stack_fffffffffffff30f;
  undefined4 in_stack_fffffffffffff310;
  int in_stack_fffffffffffff314;
  undefined7 in_stack_fffffffffffff318;
  undefined1 in_stack_fffffffffffff31f;
  CBlockIndex *in_stack_fffffffffffff320;
  CCoinsViewCache *in_stack_fffffffffffff328;
  CTransaction *in_stack_fffffffffffff330;
  type in_stack_fffffffffffff340;
  undefined7 in_stack_fffffffffffff348;
  undefined1 in_stack_fffffffffffff34f;
  CTransactionRef *in_stack_fffffffffffff350;
  TxValidationState *in_stack_fffffffffffff3d0;
  undefined7 in_stack_fffffffffffff3d8;
  undefined1 in_stack_fffffffffffff3df;
  undefined7 in_stack_fffffffffffff420;
  byte local_8c1;
  ulong local_8c0;
  byte local_815;
  allocator<char> local_814;
  allocator<char> local_813;
  allocator<char> local_812;
  allocator<char> local_811;
  undefined8 local_810;
  undefined8 local_808;
  long local_800;
  long local_7f8;
  allocator<char> local_7e9;
  _Base_ptr local_7e8;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *local_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  long local_7c8;
  long local_7c0;
  CAmount local_7b8;
  allocator<char> local_7aa;
  allocator<char> local_7a9;
  string *local_7a8;
  uint256 *puStack_7a0;
  CTxMemPool *local_798;
  CTxIn *local_788;
  CTxIn *local_780;
  string *local_778;
  allocator<char> local_76a;
  allocator<char> local_769;
  allocator<char> local_768;
  allocator<char> local_767;
  allocator<char> local_766;
  allocator<char> local_765;
  allocator<char> local_764;
  allocator<char> local_763;
  allocator<char> local_762;
  allocator<char> local_761;
  CTxIn *local_760;
  CTxIn *local_758;
  allocator<char> local_74c;
  allocator<char> local_74b;
  allocator<char> local_74a;
  allocator<char> local_749;
  CTxIn *local_748;
  CTxIn *local_740;
  allocator<char> local_736;
  allocator<char> local_735;
  allocator<char> local_734;
  allocator<char> local_733;
  allocator<char> local_732;
  allocator<char> local_731;
  CBlockIndex *local_730;
  allocator<char> local_722;
  allocator<char> local_721;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> local_720;
  allocator<char> local_70b;
  allocator<char> local_70a;
  allocator<char> local_709;
  _Base_ptr local_708;
  undefined1 local_700;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_6f8;
  undefined1 local_6f0;
  _Base_ptr local_6e8;
  undefined1 local_6e0;
  _Base_ptr local_6b8;
  undefined1 local_6b0;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             in_stack_fffffffffffff24c,(AnnotatedMixin<std::recursive_mutex> *)0x14b2530);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffff258,(char *)in_stack_fffffffffffff250,
             in_stack_fffffffffffff24c,(AnnotatedMixin<std::recursive_mutex> *)0x14b2557);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff258);
  bVar2 = *(byte *)(in_RSI + 0x10) & 1;
  ptx_00 = (CTransactionRef *)(in_RDX + 0xd0);
  bVar3 = CheckTransaction((CTransaction *)
                           CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
                           in_stack_fffffffffffff3d0);
  if (!bVar3) {
    local_815 = 0;
    goto LAB_014b5680;
  }
  bVar3 = CTransaction::IsCoinBase((CTransaction *)in_stack_fffffffffffff258);
  if (bVar3) {
    std::allocator<char>::allocator();
    TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
               (allocator<char> *)in_stack_fffffffffffff288);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
               (allocator<char> *)in_stack_fffffffffffff288);
    local_815 = ValidationState<TxValidationResult>::Invalid
                          ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff268,TVar21,
                           (string *)in_stack_fffffffffffff258,(string *)in_stack_fffffffffffff250);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
    std::allocator<char>::~allocator(&local_70a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
    std::allocator<char>::~allocator(&local_709);
    goto LAB_014b5680;
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff260);
  if (((*(byte *)(*in_RDI + 0x219) & 1) == 0) ||
     (bVar3 = IsStandardTx((CTransaction *)in_stack_fffffffffffff298,in_stack_fffffffffffff290,
                           SUB81((ulong)in_stack_fffffffffffff288 >> 0x38,0),
                           (CFeeRate *)in_stack_fffffffffffff280,
                           (string *)
                           CONCAT17(in_stack_fffffffffffff27f,
                                    CONCAT16(in_stack_fffffffffffff27e,
                                             CONCAT24(in_stack_fffffffffffff27c,
                                                      in_stack_fffffffffffff278)))), bVar3)) {
    local_720 = TransactionSerParams::operator()
                          ((TransactionSerParams *)in_stack_fffffffffffff258,
                           in_stack_fffffffffffff250);
    sVar6 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                      ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)
                       in_stack_fffffffffffff250);
    if (sVar6 < 0x41) {
      std::allocator<char>::allocator();
      TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                 (allocator<char> *)in_stack_fffffffffffff288);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                 (allocator<char> *)in_stack_fffffffffffff288);
      local_815 = ValidationState<TxValidationResult>::Invalid
                            ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff268,TVar21
                             ,(string *)in_stack_fffffffffffff258,
                             (string *)in_stack_fffffffffffff250);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
      std::allocator<char>::~allocator(&local_722);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
      std::allocator<char>::~allocator(&local_721);
    }
    else {
      local_730 = CChain::Tip((CChain *)in_stack_fffffffffffff258);
      inline_assertion_check<true,CBlockIndex*>
                ((CBlockIndex **)in_stack_fffffffffffff288,(char *)in_stack_fffffffffffff280,
                 CONCAT13(in_stack_fffffffffffff27f,
                          CONCAT12(in_stack_fffffffffffff27e,in_stack_fffffffffffff27c)),
                 (char *)in_stack_fffffffffffff270,(char *)in_stack_fffffffffffff268);
      bVar3 = CheckFinalTxAtTip((CBlockIndex *)in_stack_fffffffffffff268,
                                (CTransaction *)in_stack_fffffffffffff260);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        CTransaction::GetWitnessHash
                  ((CTransaction *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
        transaction_identifier::operator_cast_to_uint256_
                  ((transaction_identifier<true> *)
                   CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
        GenTxid::Wtxid((uint256 *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
        bVar3 = CTxMemPool::exists(in_stack_fffffffffffff2b0,
                                   (GenTxid *)
                                   CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8));
        if (bVar3) {
          std::allocator<char>::allocator();
          TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                     (allocator<char> *)in_stack_fffffffffffff288);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                     (allocator<char> *)in_stack_fffffffffffff288);
          local_815 = ValidationState<TxValidationResult>::Invalid
                                ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff268,
                                 TVar21,(string *)in_stack_fffffffffffff258,
                                 (string *)in_stack_fffffffffffff250);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
          std::allocator<char>::~allocator(&local_734);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
          std::allocator<char>::~allocator(&local_733);
        }
        else {
          CTransaction::GetHash
                    ((CTransaction *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
          transaction_identifier::operator_cast_to_uint256_
                    ((transaction_identifier<false> *)
                     CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
          GenTxid::Txid((uint256 *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
          bVar3 = CTxMemPool::exists(in_stack_fffffffffffff2b0,
                                     (GenTxid *)
                                     CONCAT17(in_stack_fffffffffffff2af,in_stack_fffffffffffff2a8));
          if (bVar3) {
            std::allocator<char>::allocator();
            TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                       (allocator<char> *)in_stack_fffffffffffff288);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                       (allocator<char> *)in_stack_fffffffffffff288);
            local_815 = ValidationState<TxValidationResult>::Invalid
                                  ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff268,
                                   TVar21,(string *)in_stack_fffffffffffff258,
                                   (string *)in_stack_fffffffffffff250);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
            std::allocator<char>::~allocator(&local_736);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
            std::allocator<char>::~allocator(&local_735);
          }
          else {
            local_740 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                           (&in_stack_fffffffffffff250->vin);
            local_748 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                                           (&in_stack_fffffffffffff250->vin);
            while( true ) {
              bVar3 = __gnu_cxx::
                      operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                  *)in_stack_fffffffffffff258,
                                 (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                  *)in_stack_fffffffffffff250);
              if (((bVar3 ^ 0xffU) & 1) == 0) break;
              __gnu_cxx::
              __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
              operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                         *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
              pCVar7 = CTxMemPool::GetConflictTx
                                 ((CTxMemPool *)in_stack_fffffffffffff268,
                                  (COutPoint *)in_stack_fffffffffffff260);
              if (pCVar7 != (CTransaction *)0x0) {
                if ((*(byte *)(in_RSI + 0x21) & 1) == 0) {
                  std::allocator<char>::allocator();
                  TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                             (allocator<char> *)in_stack_fffffffffffff288);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                             (allocator<char> *)in_stack_fffffffffffff288);
                  local_815 = ValidationState<TxValidationResult>::Invalid
                                        ((ValidationState<TxValidationResult> *)
                                         in_stack_fffffffffffff268,TVar21,
                                         (string *)in_stack_fffffffffffff258,
                                         (string *)in_stack_fffffffffffff250);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                  std::allocator<char>::~allocator(&local_74a);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                  std::allocator<char>::~allocator(&local_749);
                  goto LAB_014b5662;
                }
                CTransaction::GetHash
                          ((CTransaction *)
                           CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                sVar14 = std::
                         set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                         ::count((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                  *)in_stack_fffffffffffff258,(key_type *)in_stack_fffffffffffff250)
                ;
                if (sVar14 == 0) {
                  bVar3 = true;
                  if ((*(byte *)(*in_RDI + 0x21a) & 1) == 0) {
                    bVar4 = SignalsOptInRBF((CTransaction *)in_stack_fffffffffffff260);
                    bVar3 = true;
                    if (!bVar4) {
                      bVar3 = pCVar7->version == 3;
                    }
                  }
                  if (!bVar3) {
                    std::allocator<char>::allocator();
                    TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                               (allocator<char> *)in_stack_fffffffffffff288);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                               (allocator<char> *)in_stack_fffffffffffff288);
                    local_815 = ValidationState<TxValidationResult>::Invalid
                                          ((ValidationState<TxValidationResult> *)
                                           in_stack_fffffffffffff268,TVar21,
                                           (string *)in_stack_fffffffffffff258,
                                           (string *)in_stack_fffffffffffff250);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                    std::allocator<char>::~allocator(&local_74c);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                    std::allocator<char>::~allocator(&local_74b);
                    goto LAB_014b5662;
                  }
                  CTransaction::GetHash
                            ((CTransaction *)
                             CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                  pVar18 = std::
                           set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                           ::insert((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                     *)in_stack_fffffffffffff258,
                                    (value_type *)in_stack_fffffffffffff250);
                  local_6b8 = (_Base_ptr)pVar18.first._M_node;
                  local_6b0 = pVar18.second;
                }
              }
              __gnu_cxx::
              __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
              operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
            }
            CCoinsViewBacked::SetBackend
                      ((CCoinsViewBacked *)
                       CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248),
                       (CCoinsView *)0x14b361f);
            Chainstate::CoinsTip((Chainstate *)in_stack_fffffffffffff268);
            local_758 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                           (&in_stack_fffffffffffff250->vin);
            local_760 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                                           (&in_stack_fffffffffffff250->vin);
            while( true ) {
              bVar3 = __gnu_cxx::
                      operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                  *)in_stack_fffffffffffff258,
                                 (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                  *)in_stack_fffffffffffff250);
              if (((bVar3 ^ 0xffU) & 1) == 0) break;
              __gnu_cxx::
              __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
              operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                         *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
              bVar3 = CCoinsViewCache::HaveCoinInCache
                                (in_stack_fffffffffffff260,(COutPoint *)in_stack_fffffffffffff258);
              if (!bVar3) {
                std::vector<COutPoint,_std::allocator<COutPoint>_>::push_back
                          ((vector<COutPoint,_std::allocator<COutPoint>_> *)
                           in_stack_fffffffffffff258,(value_type *)in_stack_fffffffffffff250);
              }
              bVar3 = CCoinsViewCache::HaveCoin
                                (in_stack_fffffffffffff260,(COutPoint *)in_stack_fffffffffffff258);
              if (!bVar3) {
                local_8c0 = 0;
                goto LAB_014b3741;
              }
              __gnu_cxx::
              __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
              operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
            }
            CCoinsViewCache::GetBestBlock(in_stack_fffffffffffff258);
            CCoinsViewBacked::SetBackend
                      ((CCoinsViewBacked *)
                       CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248),
                       (CCoinsView *)0x14b3b2b);
            CCoinsViewCache::GetBestBlock(in_stack_fffffffffffff258);
            pCVar9 = ::node::BlockManager::LookupBlockIndex
                               (in_stack_fffffffffffff268,(uint256 *)in_stack_fffffffffffff260);
            pCVar10 = CChain::Tip((CChain *)in_stack_fffffffffffff258);
            if (pCVar9 != pCVar10) {
              __assert_fail("m_active_chainstate.m_blockman.LookupBlockIndex(m_view.GetBestBlock()) == m_active_chainstate.m_chain.Tip()"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                            ,0x374,
                            "bool (anonymous namespace)::MemPoolAccept::PreChecks(ATMPArgs &, Workspace &)"
                           );
            }
            CChain::Tip((CChain *)in_stack_fffffffffffff258);
            CalculateLockPointsAtTip
                      (in_stack_fffffffffffff2f0,(CCoinsView *)in_stack_fffffffffffff2e8,
                       (CTransaction *)in_stack_fffffffffffff2e0);
            bVar3 = std::optional<LockPoints>::has_value
                              ((optional<LockPoints> *)
                               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
            if (bVar3) {
              CChain::Tip((CChain *)in_stack_fffffffffffff258);
              std::optional<LockPoints>::operator*
                        ((optional<LockPoints> *)
                         CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
              bVar3 = CheckSequenceLocksAtTip
                                ((CBlockIndex *)in_stack_fffffffffffff260,
                                 (LockPoints *)in_stack_fffffffffffff258);
              if (bVar3) {
                CChain::Height((CChain *)
                               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                bVar3 = Consensus::CheckTxInputs
                                  ((CTransaction *)in_stack_fffffffffffff328,
                                   (TxValidationState *)in_stack_fffffffffffff320,
                                   (CCoinsViewCache *)
                                   CONCAT17(in_stack_fffffffffffff31f,in_stack_fffffffffffff318),
                                   in_stack_fffffffffffff314,
                                   (CAmount *)
                                   CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308));
                if (bVar3) {
                  if ((*(byte *)(*in_RDI + 0x219) & 1) != 0) {
                    bVar3 = AreInputsStandard((CTransaction *)in_stack_fffffffffffff2e8,
                                              in_stack_fffffffffffff2e0);
                    if (!bVar3) {
                      std::allocator<char>::allocator();
                      TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                                 (allocator<char> *)in_stack_fffffffffffff288);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                                 (allocator<char> *)in_stack_fffffffffffff288);
                      local_815 = ValidationState<TxValidationResult>::Invalid
                                            ((ValidationState<TxValidationResult> *)
                                             in_stack_fffffffffffff268,TVar21,
                                             (string *)in_stack_fffffffffffff258,
                                             (string *)in_stack_fffffffffffff250);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                      std::allocator<char>::~allocator(&local_768);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                      std::allocator<char>::~allocator(&local_767);
                      goto LAB_014b5662;
                    }
                  }
                  bVar3 = CTransaction::HasWitness
                                    ((CTransaction *)
                                     CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                  if ((bVar3) && ((*(byte *)(*in_RDI + 0x219) & 1) != 0)) {
                    bVar3 = IsWitnessStandard(in_stack_fffffffffffff330,in_stack_fffffffffffff328);
                    if (!bVar3) {
                      std::allocator<char>::allocator();
                      TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                                 (allocator<char> *)in_stack_fffffffffffff288);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                                 (allocator<char> *)in_stack_fffffffffffff288);
                      local_815 = ValidationState<TxValidationResult>::Invalid
                                            ((ValidationState<TxValidationResult> *)
                                             in_stack_fffffffffffff268,TVar21,
                                             (string *)in_stack_fffffffffffff258,
                                             (string *)in_stack_fffffffffffff250);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                      std::allocator<char>::~allocator(&local_76a);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                      std::allocator<char>::~allocator(&local_769);
                      goto LAB_014b5662;
                    }
                  }
                  local_778 = (string *)
                              GetTransactionSigOpCost
                                        (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
                                         (uint32_t)((ulong)in_stack_fffffffffffff290 >> 0x20));
                  *(undefined8 *)(in_RDX + 0xb0) = *(undefined8 *)(in_RDX + 0xa8);
                  transaction_identifier::operator_cast_to_uint256_
                            ((transaction_identifier<false> *)
                             CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                  CTxMemPool::ApplyDelta
                            ((CTxMemPool *)in_stack_fffffffffffff268,
                             (uint256 *)in_stack_fffffffffffff260,
                             (CAmount *)in_stack_fffffffffffff258);
                  local_8c1 = 0;
                  local_780 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                                 (&in_stack_fffffffffffff250->vin);
                  local_788 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                                                 (&in_stack_fffffffffffff250->vin);
                  while( true ) {
                    bVar3 = __gnu_cxx::
                            operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                      ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                        *)in_stack_fffffffffffff258,
                                       (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                        *)in_stack_fffffffffffff250);
                    fSearchForParents = (undefined1)((ulong)in_stack_fffffffffffff2f8 >> 0x38);
                    entry_height = (uint)((ulong)in_stack_fffffffffffff2c8 >> 0x20);
                    if (((bVar3 ^ 0xffU) & 1) == 0) break;
                    __gnu_cxx::
                    __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
                    operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                    CCoinsViewCache::AccessCoin
                              (in_stack_fffffffffffff258,(COutPoint *)in_stack_fffffffffffff250);
                    bVar3 = Coin::IsCoinBase((Coin *)CONCAT44(in_stack_fffffffffffff24c,
                                                              in_stack_fffffffffffff248));
                    fSearchForParents = (undefined1)((ulong)in_stack_fffffffffffff2f8 >> 0x38);
                    entry_height = (uint)((ulong)in_stack_fffffffffffff2c8 >> 0x20);
                    if (bVar3) {
                      local_8c1 = 1;
                      break;
                    }
                    __gnu_cxx::
                    __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
                    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                  }
                  if (bVar2 == 0) {
                    CTxMemPool::GetSequence
                              ((CTxMemPool *)
                               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                  }
                  operator_new(0x110);
                  CChain::Height((CChain *)
                                 CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                  debug_message = local_778;
                  pLVar11 = std::optional<LockPoints>::value
                                      ((optional<LockPoints> *)in_stack_fffffffffffff258);
                  this_01 = (CTxMemPool *)pLVar11->maxInputBlock;
                  reject_reason = *(string **)pLVar11;
                  txid = (uint256 *)pLVar11->time;
                  in_stack_fffffffffffff248 = local_8c1 & 1;
                  lp._4_4_ = in_stack_fffffffffffff314;
                  lp.height = in_stack_fffffffffffff310;
                  lp.time._0_7_ = in_stack_fffffffffffff318;
                  lp.time._7_1_ = in_stack_fffffffffffff31f;
                  lp.maxInputBlock = in_stack_fffffffffffff320;
                  local_7a8 = reject_reason;
                  puStack_7a0 = txid;
                  local_798 = this_01;
                  CTxMemPoolEntry::CTxMemPoolEntry
                            (in_stack_fffffffffffff2e8,(CTransactionRef *)in_stack_fffffffffffff2e0,
                             CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8),
                             in_stack_fffffffffffff2d0,entry_height,
                             CONCAT17(in_stack_fffffffffffff2c7,in_stack_fffffffffffff2c0),
                             SUB81((ulong)in_stack_fffffffffffff2b8 >> 0x38,0),
                             CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),lp);
                  std::unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>::reset
                            ((unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_> *)
                             CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248),
                             (pointer)0x14b4579);
                  std::unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>::
                  operator->((unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_> *)
                             CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                  iVar5 = CTxMemPoolEntry::GetTxSize
                                    ((CTxMemPoolEntry *)
                                     CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                  *(long *)(in_RDX + 0xa0) = (long)iVar5;
                  if ((long)local_778 < 0x3e81) {
                    if (bVar2 == 0) {
                      peVar12 = std::
                                __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)CONCAT44(in_stack_fffffffffffff24c,
                                                         in_stack_fffffffffffff248));
                      if (peVar12->version != 3) {
                        lVar1 = *(long *)(in_RDX + 0xb0);
                        CVar13 = CFeeRate::GetFee((CFeeRate *)this_01,
                                                  (uint32_t)((ulong)txid >> 0x20));
                        if (lVar1 < CVar13) {
                          std::allocator<char>::allocator();
                          TVar21 = (TxValidationResult)((ulong)txid >> 0x20);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                                     (allocator<char> *)in_stack_fffffffffffff288);
                          local_7b8 = CFeeRate::GetFee((CFeeRate *)this_01,TVar21);
                          tinyformat::format<long,long>
                                    ((char *)in_stack_fffffffffffff288,
                                     (long *)in_stack_fffffffffffff280,
                                     (long *)CONCAT17(in_stack_fffffffffffff27f,
                                                      CONCAT16(in_stack_fffffffffffff27e,
                                                               CONCAT24(in_stack_fffffffffffff27c,
                                                                        in_stack_fffffffffffff278)))
                                    );
                          local_815 = ValidationState<TxValidationResult>::Invalid
                                                ((ValidationState<TxValidationResult> *)this_01,
                                                 TVar21,reject_reason,debug_message);
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248
                                                ));
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248
                                                ));
                          std::allocator<char>::~allocator(&local_7aa);
                          goto LAB_014b5662;
                        }
                      }
                    }
                    if ((bVar2 == 0) && ((*(byte *)(in_RSI + 0x24) & 1) == 0)) {
                      bVar3 = CheckFeeRate(in_stack_fffffffffffff2b8,
                                           (size_t)in_stack_fffffffffffff2b0,
                                           (CAmount)in_stack_fffffffffffff2e8,
                                           (TxValidationState *)
                                           CONCAT17(in_stack_fffffffffffff2af,
                                                    in_stack_fffffffffffff2a8));
                      if (!bVar3) {
                        local_815 = 0;
                        goto LAB_014b5662;
                      }
                    }
                    CTxMemPool::GetIterSet
                              ((CTxMemPool *)
                               CONCAT17(in_stack_fffffffffffff2c7,in_stack_fffffffffffff2c0),
                               (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                *)in_stack_fffffffffffff2b8);
                    std::
                    set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                    ::operator=((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                 *)reject_reason,
                                (set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                 *)debug_message);
                    std::
                    set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                    ::~set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                    lVar1 = *in_RDI;
                    local_7d8 = *(undefined8 *)(lVar1 + 0x220);
                    local_7d0 = *(undefined8 *)(lVar1 + 0x228);
                    local_7c8 = *(long *)(lVar1 + 0x230);
                    local_7c0 = *(long *)(lVar1 + 0x238);
                    sVar14 = std::
                             set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                             ::size((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248)
                                   );
                    if ((sVar14 == 1) && ((*(byte *)(in_RSI + 0x38) & 1) != 0)) {
                      sVar15 = std::
                               set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                               ::size((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                       *)CONCAT44(in_stack_fffffffffffff24c,
                                                  in_stack_fffffffffffff248));
                      if (sVar15 != 1) {
                        __assert_fail("ws.m_iters_conflicting.size() == 1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                      ,0x3de,
                                      "bool (anonymous namespace)::MemPoolAccept::PreChecks(ATMPArgs &, Workspace &)"
                                     );
                      }
                      local_7e8 = (_Base_ptr)
                                  std::
                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                  ::begin((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                           *)debug_message);
                      phVar16 = std::
                                _Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                ::operator*((_Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                             *)CONCAT44(in_stack_fffffffffffff24c,
                                                        in_stack_fffffffffffff248));
                      local_7e0 = phVar16->node;
                      local_7c8 = local_7c8 + 1;
                      boost::operators_impl::
                      dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                      ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                                    *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248))
                      ;
                      iVar17 = CTxMemPoolEntry::GetSizeWithDescendants
                                         ((CTxMemPoolEntry *)
                                          CONCAT44(in_stack_fffffffffffff24c,
                                                   in_stack_fffffffffffff248));
                      local_7c0 = iVar17 + local_7c0;
                    }
                    std::unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>::
                    operator*((unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_> *)
                              reject_reason);
                    CTxMemPool::CalculateMemPoolAncestors
                              ((CTxMemPool *)
                               CONCAT44(in_stack_fffffffffffff314,in_stack_fffffffffffff310),
                               (CTxMemPoolEntry *)
                               CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
                               in_stack_fffffffffffff300,(bool)fSearchForParents);
                    bVar3 = util::Result::operator_cast_to_bool
                                      ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                        *)CONCAT44(in_stack_fffffffffffff24c,
                                                   in_stack_fffffffffffff248));
                    if (bVar3) {
                      util::
                      Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                      ::operator*((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                      std::
                      set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                      ::operator=((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)reject_reason,
                                  (set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)debug_message);
                      ptx_00 = in_stack_fffffffffffff350;
LAB_014b50f7:
                      bVar3 = false;
                    }
                    else {
                      util::
                      ErrorString<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>>
                                ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                  *)in_stack_fffffffffffff280);
                      std::__cxx11::string::string
                                (in_stack_fffffffffffff288,in_stack_fffffffffffff280);
                      bilingual_str::~bilingual_str
                                ((bilingual_str *)
                                 CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                      if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                                   (allocator<char> *)in_stack_fffffffffffff288);
                        local_815 = ValidationState<TxValidationResult>::Invalid
                                              ((ValidationState<TxValidationResult> *)this_01,
                                               (TxValidationResult)((ulong)txid >> 0x20),
                                               reject_reason,debug_message);
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248))
                        ;
                        std::allocator<char>::~allocator(&local_7e9);
                        bVar3 = true;
                        ptx_00 = in_stack_fffffffffffff350;
                      }
                      else {
                        local_810 = 2;
                        local_808 = local_7d0;
                        local_800 = local_7c8 + 1;
                        local_7f8 = local_7c0 + 10000;
                        if (*(long *)(in_RDX + 0xa0) < 0x2711) {
                          peVar12 = std::
                                    __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)CONCAT44(in_stack_fffffffffffff24c,
                                                             in_stack_fffffffffffff248));
                          if (peVar12->version != 3) {
                            in_stack_fffffffffffff340 =
                                 std::
                                 unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                                 ::operator*((unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                                              *)reject_reason);
                            CTxMemPool::CalculateMemPoolAncestors
                                      ((CTxMemPool *)
                                       CONCAT44(in_stack_fffffffffffff314,in_stack_fffffffffffff310)
                                       ,(CTxMemPoolEntry *)
                                        CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308
                                                ),in_stack_fffffffffffff300,(bool)fSearchForParents)
                            ;
                            bVar3 = util::Result::operator_cast_to_bool
                                              ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                                *)CONCAT44(in_stack_fffffffffffff24c,
                                                           in_stack_fffffffffffff248));
                            if (bVar3) {
                              util::
                              Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                              ::operator*((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                           *)CONCAT44(in_stack_fffffffffffff24c,
                                                      in_stack_fffffffffffff248));
                              std::
                              set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                              ::operator=((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                           *)reject_reason,
                                          (set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                           *)debug_message);
                              ptx_00 = in_stack_fffffffffffff350;
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff298,
                                         (char *)in_stack_fffffffffffff290,
                                         (allocator<char> *)in_stack_fffffffffffff288);
                              local_815 = ValidationState<TxValidationResult>::Invalid
                                                    ((ValidationState<TxValidationResult> *)this_01,
                                                     (TxValidationResult)((ulong)txid >> 0x20),
                                                     reject_reason,debug_message);
                              std::__cxx11::string::~string
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff24c,
                                                     in_stack_fffffffffffff248));
                              std::allocator<char>::~allocator(&local_812);
                              ptx_00 = in_stack_fffffffffffff350;
                            }
                            bVar3 = !bVar3;
                            util::
                            Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                            ::~Result((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                       *)CONCAT44(in_stack_fffffffffffff24c,
                                                  in_stack_fffffffffffff248));
                            if (!bVar3) {
                              bVar3 = false;
                            }
                            goto LAB_014b50bc;
                          }
                        }
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                                   (allocator<char> *)in_stack_fffffffffffff288);
                        local_815 = ValidationState<TxValidationResult>::Invalid
                                              ((ValidationState<TxValidationResult> *)this_01,
                                               (TxValidationResult)((ulong)txid >> 0x20),
                                               reject_reason,debug_message);
                        in_stack_fffffffffffff34f = local_815;
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248))
                        ;
                        std::allocator<char>::~allocator(&local_811);
                        bVar3 = true;
                      }
LAB_014b50bc:
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                      if (!bVar3) goto LAB_014b50f7;
                    }
                    util::
                    Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                    ::~Result((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                    if (!bVar3) {
                      SingleTRUCChecks_abi_cxx11_
                                (ptx_00,(setEntries *)
                                        CONCAT17(in_stack_fffffffffffff34f,in_stack_fffffffffffff348
                                                ),
                                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                  *)in_stack_fffffffffffff340,
                                 CONCAT17(local_8c1,in_stack_fffffffffffff420));
                      bVar3 = std::optional::operator_cast_to_bool
                                        ((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                                          *)CONCAT44(in_stack_fffffffffffff24c,
                                                     in_stack_fffffffffffff248));
                      if (bVar3) {
                        if ((*(byte *)(in_RSI + 0x22) & 1) != 0) {
                          std::
                          optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                          ::operator->((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                                        *)CONCAT44(in_stack_fffffffffffff24c,
                                                   in_stack_fffffffffffff248));
                          bVar3 = std::operator==((shared_ptr<const_CTransaction> *)reject_reason,
                                                  debug_message);
                          if (((bVar3 ^ 0xffU) & 1) != 0) {
                            inline_assertion_check<false,bool_const&>
                                      ((bool *)this_01,(char *)txid,
                                       (int)((ulong)reject_reason >> 0x20),(char *)debug_message,
                                       (char *)CONCAT44(in_stack_fffffffffffff24c,
                                                        in_stack_fffffffffffff248));
                            std::
                            optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                            ::operator->((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                                          *)CONCAT44(in_stack_fffffffffffff24c,
                                                     in_stack_fffffffffffff248));
                            std::
                            __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)CONCAT44(in_stack_fffffffffffff24c,
                                                     in_stack_fffffffffffff248));
                            CTransaction::GetHash
                                      ((CTransaction *)
                                       CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248)
                                      );
                            pVar18 = std::
                                     set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                     ::insert((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                               *)reject_reason,(value_type *)debug_message);
                            local_6e8 = (_Base_ptr)pVar18.first._M_node;
                            local_6e0 = pVar18.second;
                            std::
                            optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                            ::operator->((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                                          *)CONCAT44(in_stack_fffffffffffff24c,
                                                     in_stack_fffffffffffff248));
                            std::
                            __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)CONCAT44(in_stack_fffffffffffff24c,
                                                     in_stack_fffffffffffff248));
                            CTransaction::GetHash
                                      ((CTransaction *)
                                       CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248)
                                      );
                            transaction_identifier::operator_cast_to_uint256_
                                      ((transaction_identifier<false> *)
                                       CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248)
                                      );
                            oVar19 = CTxMemPool::GetIter(this_01,txid);
                            local_6f8 = oVar19.
                                        super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                        ._M_payload.
                                        super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                        ._M_payload;
                            local_6f0 = oVar19.
                                        super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                        ._M_payload.
                                        super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                        ._M_engaged;
                            std::
                            optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                            ::value((optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                     *)reject_reason);
                            pVar20 = std::
                                     set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                     ::insert((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                               *)reject_reason,(value_type *)debug_message);
                            local_708 = (_Base_ptr)pVar20.first._M_node;
                            local_700 = pVar20.second;
                            in_RDX[0x98] = '\x01';
                            goto LAB_014b545b;
                          }
                        }
                        TVar21 = (TxValidationResult)((ulong)txid >> 0x20);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                                   (allocator<char> *)in_stack_fffffffffffff288);
                        std::
                        optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                        ::operator->((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248
                                                ));
                        local_815 = ValidationState<TxValidationResult>::Invalid
                                              ((ValidationState<TxValidationResult> *)this_01,TVar21
                                               ,reject_reason,debug_message);
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248))
                        ;
                        std::allocator<char>::~allocator(&local_813);
                        bVar3 = true;
                      }
                      else {
LAB_014b545b:
                        TVar21 = (TxValidationResult)((ulong)txid >> 0x20);
                        bVar3 = false;
                      }
                      std::
                      optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                      ::~optional((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                      if (!bVar3) {
                        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(in_RDX + 0x60);
                        transaction_identifier::operator_cast_to_uint256_
                                  ((transaction_identifier<false> *)
                                   CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                        EntriesAndTxidsDisjoint_abi_cxx11_
                                  ((setEntries *)in_stack_fffffffffffff288,
                                   (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                    *)in_stack_fffffffffffff280,
                                   (uint256 *)
                                   CONCAT17(in_stack_fffffffffffff27f,
                                            CONCAT16(in_stack_fffffffffffff27e,
                                                     CONCAT24(in_stack_fffffffffffff27c,
                                                              in_stack_fffffffffffff278))));
                        bVar3 = std::optional::operator_cast_to_bool
                                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)CONCAT44(in_stack_fffffffffffff24c,
                                                       in_stack_fffffffffffff248));
                        if (bVar3) {
                          __a = &local_814;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDX,__a);
                          std::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)CONCAT44(in_stack_fffffffffffff24c,
                                                  in_stack_fffffffffffff248));
                          local_815 = ValidationState<TxValidationResult>::Invalid
                                                ((ValidationState<TxValidationResult> *)this_01,
                                                 TVar21,reject_reason,debug_message);
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248
                                                ));
                          std::allocator<char>::~allocator(&local_814);
                        }
                        std::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248)
                                   );
                        if (!bVar3) {
                          bVar3 = std::
                                  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                  ::empty((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                           *)CONCAT44(in_stack_fffffffffffff24c,
                                                      in_stack_fffffffffffff248));
                          *(bool *)(in_RDI + 0x53) =
                               (*(byte *)(in_RDI + 0x53) & 1) != 0 || ((bVar3 ^ 0xffU) & 1) != 0;
                          local_815 = 1;
                        }
                      }
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    TVar21 = (TxValidationResult)((ulong)txid >> 0x20);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                               (allocator<char> *)in_stack_fffffffffffff288);
                    tinyformat::format<long>
                              ((char *)CONCAT17(in_stack_fffffffffffff27f,
                                                CONCAT16(in_stack_fffffffffffff27e,
                                                         CONCAT24(in_stack_fffffffffffff27c,
                                                                  in_stack_fffffffffffff278))),
                               in_stack_fffffffffffff270);
                    local_815 = ValidationState<TxValidationResult>::Invalid
                                          ((ValidationState<TxValidationResult> *)this_01,TVar21,
                                           reject_reason,debug_message);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                    std::allocator<char>::~allocator(&local_7a9);
                  }
                }
                else {
                  local_815 = 0;
                }
                goto LAB_014b5662;
              }
            }
            TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                       (allocator<char> *)in_stack_fffffffffffff288);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                       (allocator<char> *)in_stack_fffffffffffff288);
            local_815 = ValidationState<TxValidationResult>::Invalid
                                  ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff268,
                                   TVar21,(string *)in_stack_fffffffffffff258,
                                   (string *)in_stack_fffffffffffff250);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
            std::allocator<char>::~allocator(&local_766);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
            std::allocator<char>::~allocator(&local_765);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                   (allocator<char> *)in_stack_fffffffffffff288);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
                   (allocator<char> *)in_stack_fffffffffffff288);
        local_815 = ValidationState<TxValidationResult>::Invalid
                              ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff268,
                               TVar21,(string *)in_stack_fffffffffffff258,
                               (string *)in_stack_fffffffffffff250);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
        std::allocator<char>::~allocator(&local_732);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
        std::allocator<char>::~allocator(&local_731);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
               (allocator<char> *)in_stack_fffffffffffff288);
    local_815 = ValidationState<TxValidationResult>::Invalid
                          ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff268,TVar21,
                           (string *)in_stack_fffffffffffff258,(string *)in_stack_fffffffffffff250);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
    std::allocator<char>::~allocator(&local_70b);
  }
LAB_014b5662:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
LAB_014b5680:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (bool)(local_815 & 1);
LAB_014b3741:
  sVar8 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                     CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  if (sVar8 <= local_8c0) goto LAB_014b3967;
  COutPoint::COutPoint
            ((COutPoint *)in_stack_fffffffffffff258,(Txid *)in_stack_fffffffffffff250,
             in_stack_fffffffffffff24c);
  bVar3 = CCoinsViewCache::HaveCoinInCache
                    (in_stack_fffffffffffff260,(COutPoint *)in_stack_fffffffffffff258);
  if (bVar3) {
    std::allocator<char>::allocator();
    TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
               (allocator<char> *)in_stack_fffffffffffff288);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
               (allocator<char> *)in_stack_fffffffffffff288);
    local_815 = ValidationState<TxValidationResult>::Invalid
                          ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff268,TVar21,
                           (string *)in_stack_fffffffffffff258,(string *)in_stack_fffffffffffff250);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
    std::allocator<char>::~allocator(&local_762);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
    std::allocator<char>::~allocator(&local_761);
    goto LAB_014b5662;
  }
  local_8c0 = local_8c0 + 1;
  goto LAB_014b3741;
LAB_014b3967:
  std::allocator<char>::allocator();
  TVar21 = (TxValidationResult)((ulong)in_stack_fffffffffffff260 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
             (allocator<char> *)in_stack_fffffffffffff288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff298,(char *)in_stack_fffffffffffff290,
             (allocator<char> *)in_stack_fffffffffffff288);
  local_815 = ValidationState<TxValidationResult>::Invalid
                        ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff268,TVar21,
                         (string *)in_stack_fffffffffffff258,(string *)in_stack_fffffffffffff250);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  std::allocator<char>::~allocator(&local_764);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
  std::allocator<char>::~allocator(&local_763);
  goto LAB_014b5662;
}

Assistant:

bool MemPoolAccept::PreChecks(ATMPArgs& args, Workspace& ws)
{
    AssertLockHeld(cs_main);
    AssertLockHeld(m_pool.cs);
    const CTransactionRef& ptx = ws.m_ptx;
    const CTransaction& tx = *ws.m_ptx;
    const Txid& hash = ws.m_hash;

    // Copy/alias what we need out of args
    const int64_t nAcceptTime = args.m_accept_time;
    const bool bypass_limits = args.m_bypass_limits;
    std::vector<COutPoint>& coins_to_uncache = args.m_coins_to_uncache;

    // Alias what we need out of ws
    TxValidationState& state = ws.m_state;
    std::unique_ptr<CTxMemPoolEntry>& entry = ws.m_entry;

    if (!CheckTransaction(tx, state)) {
        return false; // state filled in by CheckTransaction
    }

    // Coinbase is only valid in a block, not as a loose transaction
    if (tx.IsCoinBase())
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "coinbase");

    // Rather not work on nonstandard transactions (unless -testnet/-regtest)
    std::string reason;
    if (m_pool.m_opts.require_standard && !IsStandardTx(tx, m_pool.m_opts.max_datacarrier_bytes, m_pool.m_opts.permit_bare_multisig, m_pool.m_opts.dust_relay_feerate, reason)) {
        return state.Invalid(TxValidationResult::TX_NOT_STANDARD, reason);
    }

    // Transactions smaller than 65 non-witness bytes are not relayed to mitigate CVE-2017-12842.
    if (::GetSerializeSize(TX_NO_WITNESS(tx)) < MIN_STANDARD_TX_NONWITNESS_SIZE)
        return state.Invalid(TxValidationResult::TX_NOT_STANDARD, "tx-size-small");

    // Only accept nLockTime-using transactions that can be mined in the next
    // block; we don't want our mempool filled up with transactions that can't
    // be mined yet.
    if (!CheckFinalTxAtTip(*Assert(m_active_chainstate.m_chain.Tip()), tx)) {
        return state.Invalid(TxValidationResult::TX_PREMATURE_SPEND, "non-final");
    }

    if (m_pool.exists(GenTxid::Wtxid(tx.GetWitnessHash()))) {
        // Exact transaction already exists in the mempool.
        return state.Invalid(TxValidationResult::TX_CONFLICT, "txn-already-in-mempool");
    } else if (m_pool.exists(GenTxid::Txid(tx.GetHash()))) {
        // Transaction with the same non-witness data but different witness (same txid, different
        // wtxid) already exists in the mempool.
        return state.Invalid(TxValidationResult::TX_CONFLICT, "txn-same-nonwitness-data-in-mempool");
    }

    // Check for conflicts with in-memory transactions
    for (const CTxIn &txin : tx.vin)
    {
        const CTransaction* ptxConflicting = m_pool.GetConflictTx(txin.prevout);
        if (ptxConflicting) {
            if (!args.m_allow_replacement) {
                // Transaction conflicts with a mempool tx, but we're not allowing replacements.
                return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "bip125-replacement-disallowed");
            }
            if (!ws.m_conflicts.count(ptxConflicting->GetHash()))
            {
                // Transactions that don't explicitly signal replaceability are
                // *not* replaceable with the current logic, even if one of their
                // unconfirmed ancestors signals replaceability. This diverges
                // from BIP125's inherited signaling description (see CVE-2021-31876).
                // Applications relying on first-seen mempool behavior should
                // check all unconfirmed ancestors; otherwise an opt-in ancestor
                // might be replaced, causing removal of this descendant.
                //
                // All TRUC transactions are considered replaceable.
                //
                // Replaceability signaling of the original transactions may be
                // ignored due to node setting.
                const bool allow_rbf{m_pool.m_opts.full_rbf || SignalsOptInRBF(*ptxConflicting) || ptxConflicting->version == TRUC_VERSION};
                if (!allow_rbf) {
                    return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "txn-mempool-conflict");
                }

                ws.m_conflicts.insert(ptxConflicting->GetHash());
            }
        }
    }

    m_view.SetBackend(m_viewmempool);

    const CCoinsViewCache& coins_cache = m_active_chainstate.CoinsTip();
    // do all inputs exist?
    for (const CTxIn& txin : tx.vin) {
        if (!coins_cache.HaveCoinInCache(txin.prevout)) {
            coins_to_uncache.push_back(txin.prevout);
        }

        // Note: this call may add txin.prevout to the coins cache
        // (coins_cache.cacheCoins) by way of FetchCoin(). It should be removed
        // later (via coins_to_uncache) if this tx turns out to be invalid.
        if (!m_view.HaveCoin(txin.prevout)) {
            // Are inputs missing because we already have the tx?
            for (size_t out = 0; out < tx.vout.size(); out++) {
                // Optimistically just do efficient check of cache for outputs
                if (coins_cache.HaveCoinInCache(COutPoint(hash, out))) {
                    return state.Invalid(TxValidationResult::TX_CONFLICT, "txn-already-known");
                }
            }
            // Otherwise assume this might be an orphan tx for which we just haven't seen parents yet
            return state.Invalid(TxValidationResult::TX_MISSING_INPUTS, "bad-txns-inputs-missingorspent");
        }
    }

    // This is const, but calls into the back end CoinsViews. The CCoinsViewDB at the bottom of the
    // hierarchy brings the best block into scope. See CCoinsViewDB::GetBestBlock().
    m_view.GetBestBlock();

    // we have all inputs cached now, so switch back to dummy (to protect
    // against bugs where we pull more inputs from disk that miss being added
    // to coins_to_uncache)
    m_view.SetBackend(m_dummy);

    assert(m_active_chainstate.m_blockman.LookupBlockIndex(m_view.GetBestBlock()) == m_active_chainstate.m_chain.Tip());

    // Only accept BIP68 sequence locked transactions that can be mined in the next
    // block; we don't want our mempool filled up with transactions that can't
    // be mined yet.
    // Pass in m_view which has all of the relevant inputs cached. Note that, since m_view's
    // backend was removed, it no longer pulls coins from the mempool.
    const std::optional<LockPoints> lock_points{CalculateLockPointsAtTip(m_active_chainstate.m_chain.Tip(), m_view, tx)};
    if (!lock_points.has_value() || !CheckSequenceLocksAtTip(m_active_chainstate.m_chain.Tip(), *lock_points)) {
        return state.Invalid(TxValidationResult::TX_PREMATURE_SPEND, "non-BIP68-final");
    }

    // The mempool holds txs for the next block, so pass height+1 to CheckTxInputs
    if (!Consensus::CheckTxInputs(tx, state, m_view, m_active_chainstate.m_chain.Height() + 1, ws.m_base_fees)) {
        return false; // state filled in by CheckTxInputs
    }

    if (m_pool.m_opts.require_standard && !AreInputsStandard(tx, m_view)) {
        return state.Invalid(TxValidationResult::TX_INPUTS_NOT_STANDARD, "bad-txns-nonstandard-inputs");
    }

    // Check for non-standard witnesses.
    if (tx.HasWitness() && m_pool.m_opts.require_standard && !IsWitnessStandard(tx, m_view)) {
        return state.Invalid(TxValidationResult::TX_WITNESS_MUTATED, "bad-witness-nonstandard");
    }

    int64_t nSigOpsCost = GetTransactionSigOpCost(tx, m_view, STANDARD_SCRIPT_VERIFY_FLAGS);

    // ws.m_modified_fees includes any fee deltas from PrioritiseTransaction
    ws.m_modified_fees = ws.m_base_fees;
    m_pool.ApplyDelta(hash, ws.m_modified_fees);

    // Keep track of transactions that spend a coinbase, which we re-scan
    // during reorgs to ensure COINBASE_MATURITY is still met.
    bool fSpendsCoinbase = false;
    for (const CTxIn &txin : tx.vin) {
        const Coin &coin = m_view.AccessCoin(txin.prevout);
        if (coin.IsCoinBase()) {
            fSpendsCoinbase = true;
            break;
        }
    }

    // Set entry_sequence to 0 when bypass_limits is used; this allows txs from a block
    // reorg to be marked earlier than any child txs that were already in the mempool.
    const uint64_t entry_sequence = bypass_limits ? 0 : m_pool.GetSequence();
    entry.reset(new CTxMemPoolEntry(ptx, ws.m_base_fees, nAcceptTime, m_active_chainstate.m_chain.Height(), entry_sequence,
                                    fSpendsCoinbase, nSigOpsCost, lock_points.value()));
    ws.m_vsize = entry->GetTxSize();

    if (nSigOpsCost > MAX_STANDARD_TX_SIGOPS_COST)
        return state.Invalid(TxValidationResult::TX_NOT_STANDARD, "bad-txns-too-many-sigops",
                strprintf("%d", nSigOpsCost));

    // No individual transactions are allowed below the min relay feerate except from disconnected blocks.
    // This requirement, unlike CheckFeeRate, cannot be bypassed using m_package_feerates because,
    // while a tx could be package CPFP'd when entering the mempool, we do not have a DoS-resistant
    // method of ensuring the tx remains bumped. For example, the fee-bumping child could disappear
    // due to a replacement.
    // The only exception is TRUC transactions.
    if (!bypass_limits && ws.m_ptx->version != TRUC_VERSION && ws.m_modified_fees < m_pool.m_opts.min_relay_feerate.GetFee(ws.m_vsize)) {
        // Even though this is a fee-related failure, this result is TX_MEMPOOL_POLICY, not
        // TX_RECONSIDERABLE, because it cannot be bypassed using package validation.
        return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "min relay fee not met",
                             strprintf("%d < %d", ws.m_modified_fees, m_pool.m_opts.min_relay_feerate.GetFee(ws.m_vsize)));
    }
    // No individual transactions are allowed below the mempool min feerate except from disconnected
    // blocks and transactions in a package. Package transactions will be checked using package
    // feerate later.
    if (!bypass_limits && !args.m_package_feerates && !CheckFeeRate(ws.m_vsize, ws.m_modified_fees, state)) return false;

    ws.m_iters_conflicting = m_pool.GetIterSet(ws.m_conflicts);

    // Note that these modifications are only applicable to single transaction scenarios;
    // carve-outs are disabled for multi-transaction evaluations.
    CTxMemPool::Limits maybe_rbf_limits = m_pool.m_opts.limits;

    // Calculate in-mempool ancestors, up to a limit.
    if (ws.m_conflicts.size() == 1 && args.m_allow_carveouts) {
        // In general, when we receive an RBF transaction with mempool conflicts, we want to know whether we
        // would meet the chain limits after the conflicts have been removed. However, there isn't a practical
        // way to do this short of calculating the ancestor and descendant sets with an overlay cache of
        // changed mempool entries. Due to both implementation and runtime complexity concerns, this isn't
        // very realistic, thus we only ensure a limited set of transactions are RBF'able despite mempool
        // conflicts here. Importantly, we need to ensure that some transactions which were accepted using
        // the below carve-out are able to be RBF'ed, without impacting the security the carve-out provides
        // for off-chain contract systems (see link in the comment below).
        //
        // Specifically, the subset of RBF transactions which we allow despite chain limits are those which
        // conflict directly with exactly one other transaction (but may evict children of said transaction),
        // and which are not adding any new mempool dependencies. Note that the "no new mempool dependencies"
        // check is accomplished later, so we don't bother doing anything about it here, but if our
        // policy changes, we may need to move that check to here instead of removing it wholesale.
        //
        // Such transactions are clearly not merging any existing packages, so we are only concerned with
        // ensuring that (a) no package is growing past the package size (not count) limits and (b) we are
        // not allowing something to effectively use the (below) carve-out spot when it shouldn't be allowed
        // to.
        //
        // To check these we first check if we meet the RBF criteria, above, and increment the descendant
        // limits by the direct conflict and its descendants (as these are recalculated in
        // CalculateMempoolAncestors by assuming the new transaction being added is a new descendant, with no
        // removals, of each parent's existing dependent set). The ancestor count limits are unmodified (as
        // the ancestor limits should be the same for both our new transaction and any conflicts).
        // We don't bother incrementing m_limit_descendants by the full removal count as that limit never comes
        // into force here (as we're only adding a single transaction).
        assert(ws.m_iters_conflicting.size() == 1);
        CTxMemPool::txiter conflict = *ws.m_iters_conflicting.begin();

        maybe_rbf_limits.descendant_count += 1;
        maybe_rbf_limits.descendant_size_vbytes += conflict->GetSizeWithDescendants();
    }

    if (auto ancestors{m_pool.CalculateMemPoolAncestors(*entry, maybe_rbf_limits)}) {
        ws.m_ancestors = std::move(*ancestors);
    } else {
        // If CalculateMemPoolAncestors fails second time, we want the original error string.
        const auto error_message{util::ErrorString(ancestors).original};

        // Carve-out is not allowed in this context; fail
        if (!args.m_allow_carveouts) {
            return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "too-long-mempool-chain", error_message);
        }

        // Contracting/payment channels CPFP carve-out:
        // If the new transaction is relatively small (up to 40k weight)
        // and has at most one ancestor (ie ancestor limit of 2, including
        // the new transaction), allow it if its parent has exactly the
        // descendant limit descendants. The transaction also cannot be TRUC,
        // as its topology restrictions do not allow a second child.
        //
        // This allows protocols which rely on distrusting counterparties
        // being able to broadcast descendants of an unconfirmed transaction
        // to be secure by simply only having two immediately-spendable
        // outputs - one for each counterparty. For more info on the uses for
        // this, see https://lists.linuxfoundation.org/pipermail/bitcoin-dev/2018-November/016518.html
        CTxMemPool::Limits cpfp_carve_out_limits{
            .ancestor_count = 2,
            .ancestor_size_vbytes = maybe_rbf_limits.ancestor_size_vbytes,
            .descendant_count = maybe_rbf_limits.descendant_count + 1,
            .descendant_size_vbytes = maybe_rbf_limits.descendant_size_vbytes + EXTRA_DESCENDANT_TX_SIZE_LIMIT,
        };
        if (ws.m_vsize > EXTRA_DESCENDANT_TX_SIZE_LIMIT || ws.m_ptx->version == TRUC_VERSION) {
            return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "too-long-mempool-chain", error_message);
        }
        if (auto ancestors_retry{m_pool.CalculateMemPoolAncestors(*entry, cpfp_carve_out_limits)}) {
            ws.m_ancestors = std::move(*ancestors_retry);
        } else {
            return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "too-long-mempool-chain", error_message);
        }
    }

    // Even though just checking direct mempool parents for inheritance would be sufficient, we
    // check using the full ancestor set here because it's more convenient to use what we have
    // already calculated.
    if (const auto err{SingleTRUCChecks(ws.m_ptx, ws.m_ancestors, ws.m_conflicts, ws.m_vsize)}) {
        // Single transaction contexts only.
        if (args.m_allow_sibling_eviction && err->second != nullptr) {
            // We should only be considering where replacement is considered valid as well.
            Assume(args.m_allow_replacement);

            // Potential sibling eviction. Add the sibling to our list of mempool conflicts to be
            // included in RBF checks.
            ws.m_conflicts.insert(err->second->GetHash());
            // Adding the sibling to m_iters_conflicting here means that it doesn't count towards
            // RBF Carve Out above. This is correct, since removing to-be-replaced transactions from
            // the descendant count is done separately in SingleTRUCChecks for TRUC transactions.
            ws.m_iters_conflicting.insert(m_pool.GetIter(err->second->GetHash()).value());
            ws.m_sibling_eviction = true;
            // The sibling will be treated as part of the to-be-replaced set in ReplacementChecks.
            // Note that we are not checking whether it opts in to replaceability via BIP125 or TRUC
            // (which is normally done in PreChecks). However, the only way a TRUC transaction can
            // have a non-TRUC and non-BIP125 descendant is due to a reorg.
        } else {
            return state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "TRUC-violation", err->first);
        }
    }

    // A transaction that spends outputs that would be replaced by it is invalid. Now
    // that we have the set of all ancestors we can detect this
    // pathological case by making sure ws.m_conflicts and ws.m_ancestors don't
    // intersect.
    if (const auto err_string{EntriesAndTxidsDisjoint(ws.m_ancestors, ws.m_conflicts, hash)}) {
        // We classify this as a consensus error because a transaction depending on something it
        // conflicts with would be inconsistent.
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-spends-conflicting-tx", *err_string);
    }

    // We want to detect conflicts in any tx in a package to trigger package RBF logic
    m_subpackage.m_rbf |= !ws.m_conflicts.empty();
    return true;
}